

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x78 = 0x983148;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x60 = 0x983288;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x983170;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x110 = 0x983198;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x9831c0;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x178 = 0x9831e8;
  this[-1].MeshWidth.ptr = 4.9279530425266e-317;
  this[-1].LongitudinalBarNominalDiameter = 4.92797280515243e-317;
  this[-1].LongitudinalBarCrossSectionArea = 4.92799256777826e-317;
  if ((undefined1 *)this[-1].LongitudinalBarSpacing != &this[-1].field_0x1f0) {
    operator_delete((undefined1 *)this[-1].LongitudinalBarSpacing,*(long *)&this[-1].field_0x1f0 + 1
                   );
  }
  IfcElement::~IfcElement
            ((IfcElement *)
             &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
              super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x78,
             &PTR_construction_vtable_24__00982f10);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}